

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::_::
CopyConstructArray_<capnp::compiler::NodeTranslator::BrandedDecl,_capnp::compiler::NodeTranslator::BrandedDecl_*,_false,_false>
::ExceptionGuard::~ExceptionGuard(ExceptionGuard *this)

{
  BrandedDecl *pBVar1;
  BrandScope *pBVar2;
  Disposer *pDVar3;
  BrandedDecl *pBVar4;
  
  pBVar4 = this->pos;
  if (this->start < pBVar4) {
    do {
      pBVar1 = pBVar4 + -1;
      this->pos = pBVar1;
      pBVar2 = pBVar4[-1].brand.ptr;
      if (pBVar2 != (BrandScope *)0x0) {
        pBVar4[-1].brand.ptr = (BrandScope *)0x0;
        pDVar3 = pBVar4[-1].brand.disposer;
        (**pDVar3->_vptr_Disposer)
                  (pDVar3,(pBVar2->super_Refcounted).super_Disposer._vptr_Disposer[-2] +
                          (long)&(pBVar2->super_Refcounted).super_Disposer._vptr_Disposer);
      }
      if ((pBVar1->body).tag == 1) {
        (pBVar1->body).tag = 0;
      }
      if ((pBVar1->body).tag == 2) {
        (pBVar1->body).tag = 0;
      }
      pBVar4 = this->pos;
    } while (this->start < pBVar4);
  }
  return;
}

Assistant:

~ExceptionGuard() noexcept(false) {
      while (pos > start) {
        dtor(*--pos);
      }
    }